

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O2

int GENERAL_NAME_set0_othername(GENERAL_NAME *gen,ASN1_OBJECT *oid,ASN1_TYPE *value)

{
  OTHERNAME *pOVar1;
  
  pOVar1 = OTHERNAME_new();
  if (pOVar1 != (OTHERNAME *)0x0) {
    ASN1_TYPE_free(pOVar1->value);
    pOVar1->type_id = oid;
    pOVar1->value = value;
    (gen->d).otherName = pOVar1;
    gen->type = 0;
  }
  return (uint)(pOVar1 != (OTHERNAME *)0x0);
}

Assistant:

int GENERAL_NAME_set0_othername(GENERAL_NAME *gen, ASN1_OBJECT *oid,
                                ASN1_TYPE *value) {
  OTHERNAME *oth;
  oth = OTHERNAME_new();
  if (!oth) {
    return 0;
  }
  ASN1_TYPE_free(oth->value);
  oth->type_id = oid;
  oth->value = value;
  GENERAL_NAME_set0_value(gen, GEN_OTHERNAME, oth);
  return 1;
}